

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_e2ed01::HandleCreateLinkCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pbVar1;
  __type _Var2;
  bool bVar3;
  int iVar4;
  Status SVar5;
  string *__rhs;
  string_view name;
  static_string_view name_00;
  static_string_view name_01;
  string_view value;
  string_view value_00;
  string_view value_01;
  CopyStatus CVar6;
  Status linked;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string err;
  Arguments arguments;
  string result;
  _Any_data local_78;
  _Manager_type local_68;
  pointer ppStack_60;
  pointer local_58;
  pointer ppStack_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unconsumedArgs;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"CREATE_LINK must be called with at least two additional arguments"
               ,(allocator<char> *)&arguments);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&result);
    return false;
  }
  if (((anonymous_namespace)::
       HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar4 != 0)) {
    local_58 = (pointer)0x0;
    ppStack_50 = (pointer)0x0;
    local_68 = (_Manager_type)0x0;
    ppStack_60 = (pointer)0x0;
    local_78._0_8_ = 0;
    local_78._8_8_ = 0;
    result.field_2._M_allocated_capacity = 0;
    result.field_2._8_8_ = 0;
    result._M_dataplus._M_p = (pointer)0x0;
    result._M_string_length = 0;
    arguments.Result._M_dataplus._M_p = (pointer)0x0;
    arguments.Result._M_string_length = 0;
    arguments.Result.field_2._8_8_ =
         std::
         _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
         ::_M_invoke;
    arguments.Result.field_2._M_allocated_capacity =
         (size_type)
         std::
         _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
         ::_M_manager;
    name._M_str = "RESULT";
    name._M_len = 6;
    ArgumentParser::Base::Bind((Base *)&result,name,(KeywordAction *)&arguments);
    std::_Function_base::~_Function_base((_Function_base *)&arguments);
    name_00.super_string_view._M_str = "COPY_ON_ERROR";
    name_00.super_string_view._M_len = 0xd;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)&result,name_00,0x20);
    name_01.super_string_view._M_str = "SYMBOLIC";
    name_01.super_string_view._M_len = 8;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)&result,name_01,0x21);
    ArgumentParser::ActionMap::ActionMap
              ((ActionMap *)&HandleCreateLinkCommand::parser,(ActionMap *)&result);
    ArgumentParser::ActionMap::~ActionMap((ActionMap *)&result);
    __cxa_atexit(ArgumentParser::Base::~Base,&HandleCreateLinkCommand::parser,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  result.field_2._M_allocated_capacity = (size_type)&unconsumedArgs;
  unconsumedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unconsumedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unconsumedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  err._M_string_length =
       (size_type)
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  arguments.Result._M_dataplus._M_p = (pointer)&arguments.Result.field_2;
  arguments.Result._M_string_length = 0;
  err._M_dataplus._M_p =
       (pointer)((args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 3);
  arguments.Result.field_2._M_allocated_capacity =
       arguments.Result.field_2._M_allocated_capacity & 0xffffffffffffff00;
  arguments.CopyOnError = false;
  arguments.Symbolic = false;
  result._M_dataplus._M_p = (pointer)&HandleCreateLinkCommand::parser;
  result._M_string_length = 0;
  result.field_2._8_8_ = &arguments;
  local_78._0_8_ = 0;
  local_78._8_8_ = 0;
  local_68 = (_Manager_type)0x0;
  ppStack_60 = (pointer)0x0;
  local_58 = (pointer)((ulong)local_58 & 0xffffffffffffff00);
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)&result,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&err,0);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  if (unconsumedArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      unconsumedArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator+(&err,"unknown argument: \"",
                   unconsumedArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::operator+(&result,&err,'\"');
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)&err);
    bVar3 = false;
    goto LAB_00335806;
  }
  __lhs = pbVar1 + 1;
  __rhs = pbVar1 + 2;
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_allocated_capacity = result.field_2._M_allocated_capacity & 0xffffffffffffff00;
  _Var2 = std::operator==(__lhs,__rhs);
  if (_Var2) {
    std::__cxx11::string::assign((char *)&result);
LAB_00335516:
    if (arguments.Result._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00335643:
      bVar3 = false;
    }
    else {
      bVar3 = true;
      value._M_str = result._M_dataplus._M_p;
      value._M_len = result._M_string_length;
      cmMakefile::AddDefinition(status->Makefile,&arguments.Result,value);
    }
  }
  else {
    if ((arguments.Symbolic == false) && (bVar3 = cmsys::SystemTools::FileExists(__lhs), !bVar3)) {
      std::operator+(&local_128,"Cannot hard link \'",__lhs);
      std::operator+(&err,&local_128,"\' as it does not exist.");
      std::__cxx11::string::operator=((string *)&result,(string *)&err);
      std::__cxx11::string::~string((string *)&err);
      std::__cxx11::string::~string((string *)&local_128);
      goto LAB_00335516;
    }
    bVar3 = cmsys::SystemTools::PathExists(__rhs);
    if ((!bVar3) || (SVar5 = cmsys::SystemTools::RemoveFile(__rhs), SVar5.Kind_ == Success)) {
      if (arguments.Symbolic == true) {
        linked = cmSystemTools::CreateSymlinkQuietly(__lhs,__rhs);
        if (linked.Kind_ == Success) goto LAB_00335712;
        cmsys::Status::GetString_abi_cxx11_(&local_128,&linked);
        cmStrCat<char_const(&)[33],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string>
                  (&err,(char (*) [33])"failed to create symbolic link \'",__rhs,
                   (char (*) [4])0x74ed8b,&local_128);
LAB_00335691:
        std::__cxx11::string::operator=((string *)&result,(string *)&err);
        std::__cxx11::string::~string((string *)&err);
        std::__cxx11::string::~string((string *)&local_128);
        bVar3 = false;
      }
      else {
        linked = cmSystemTools::CreateLinkQuietly(__lhs,__rhs);
        if (linked.Kind_ != Success) {
          cmsys::Status::GetString_abi_cxx11_(&local_128,&linked);
          cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string>
                    (&err,(char (*) [24])"failed to create link \'",__rhs,(char (*) [4])0x74ed8b,
                     &local_128);
          goto LAB_00335691;
        }
LAB_00335712:
        bVar3 = true;
      }
      if ((!bVar3) && (arguments.CopyOnError == true)) {
        CVar6 = cmsys::SystemTools::CopyFileAlways(__lhs,__rhs);
        linked = CVar6.super_Status;
        if (CVar6.super_Status.Kind_ == Success) {
          bVar3 = true;
        }
        else {
          cmsys::Status::GetString_abi_cxx11_(&local_128,&linked);
          std::operator+(&err,"Copy failed: ",&local_128);
          std::__cxx11::string::operator=((string *)&result,(string *)&err);
          std::__cxx11::string::~string((string *)&err);
          std::__cxx11::string::~string((string *)&local_128);
        }
      }
      if (bVar3) {
        std::__cxx11::string::assign((char *)&result);
        if (arguments.Result._M_string_length == 0) {
          bVar3 = true;
        }
        else {
LAB_003357d9:
          bVar3 = true;
          value_01._M_str = result._M_dataplus._M_p;
          value_01._M_len = result._M_string_length;
          cmMakefile::AddDefinition(status->Makefile,&arguments.Result,value_01);
        }
        goto LAB_003357f9;
      }
      if (arguments.Result._M_string_length != 0) goto LAB_003357d9;
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_00335643;
    }
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    linked.Kind_._0_1_ = 10;
    cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[44],std::__cxx11::string,char>
              (&err,(char (*) [24])"Failed to create link \'",__rhs,
               (char (*) [44])"\' because existing path cannot be removed: ",&local_128,
               (char *)&linked);
    std::__cxx11::string::~string((string *)&local_128);
    bVar3 = arguments.Result._M_string_length != 0;
    if (arguments.Result._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      value_00._M_str = err._M_dataplus._M_p;
      value_00._M_len = err._M_string_length;
      cmMakefile::AddDefinition(status->Makefile,&arguments.Result,value_00);
    }
    std::__cxx11::string::~string((string *)&err);
  }
LAB_003357f9:
  std::__cxx11::string::~string((string *)&result);
LAB_00335806:
  std::__cxx11::string::~string((string *)&arguments);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unconsumedArgs);
  return bVar3;
}

Assistant:

bool HandleCreateLinkCommand(std::vector<std::string> const& args,
                             cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("CREATE_LINK must be called with at least two additional "
                    "arguments");
    return false;
  }

  std::string const& fileName = args[1];
  std::string const& newFileName = args[2];

  struct Arguments
  {
    std::string Result;
    bool CopyOnError = false;
    bool Symbolic = false;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("RESULT"_s, &Arguments::Result)
      .Bind("COPY_ON_ERROR"_s, &Arguments::CopyOnError)
      .Bind("SYMBOLIC"_s, &Arguments::Symbolic);

  std::vector<std::string> unconsumedArgs;
  Arguments const arguments =
    parser.Parse(cmMakeRange(args).advance(3), &unconsumedArgs);

  if (!unconsumedArgs.empty()) {
    status.SetError("unknown argument: \"" + unconsumedArgs.front() + '\"');
    return false;
  }

  // The system error message generated in the operation.
  std::string result;

  // Check if the paths are distinct.
  if (fileName == newFileName) {
    result = "CREATE_LINK cannot use same file and newfile";
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, result);
      return true;
    }
    status.SetError(result);
    return false;
  }

  // Hard link requires original file to exist.
  if (!arguments.Symbolic && !cmSystemTools::FileExists(fileName)) {
    result = "Cannot hard link \'" + fileName + "\' as it does not exist.";
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, result);
      return true;
    }
    status.SetError(result);
    return false;
  }

  // Check if the new file already exists and remove it.
  if (cmSystemTools::PathExists(newFileName) &&
      !cmSystemTools::RemoveFile(newFileName)) {
    auto err = cmStrCat("Failed to create link '", newFileName,
                        "' because existing path cannot be removed: ",
                        cmSystemTools::GetLastSystemError(), '\n');

    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, err);
      return true;
    }
    status.SetError(err);
    return false;
  }

  // Whether the operation completed successfully.
  bool completed = false;

  // Check if the command requires a symbolic link.
  if (arguments.Symbolic) {
    cmsys::Status linked =
      cmSystemTools::CreateSymlinkQuietly(fileName, newFileName);
    if (linked) {
      completed = true;
    } else {
      result = cmStrCat("failed to create symbolic link '", newFileName,
                        "': ", linked.GetString());
    }
  } else {
    cmsys::Status linked =
      cmSystemTools::CreateLinkQuietly(fileName, newFileName);
    if (linked) {
      completed = true;
    } else {
      result = cmStrCat("failed to create link '", newFileName,
                        "': ", linked.GetString());
    }
  }

  // Check if copy-on-error is enabled in the arguments.
  if (!completed && arguments.CopyOnError) {
    cmsys::Status copied =
      cmsys::SystemTools::CopyFileAlways(fileName, newFileName);
    if (copied) {
      completed = true;
    } else {
      result = "Copy failed: " + copied.GetString();
    }
  }

  // Check if the operation was successful.
  if (completed) {
    result = "0";
  } else if (arguments.Result.empty()) {
    // The operation failed and the result is not reported in a variable.
    status.SetError(result);
    return false;
  }

  if (!arguments.Result.empty()) {
    status.GetMakefile().AddDefinition(arguments.Result, result);
  }

  return true;
}